

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

UBool __thiscall icu_63::UnifiedCache::_inProgress(UnifiedCache *this,UHashElement *element)

{
  UBool UVar1;
  SharedObject *pSStack_28;
  UBool result;
  SharedObject *value;
  UHashElement *pUStack_18;
  UErrorCode status;
  UHashElement *element_local;
  UnifiedCache *this_local;
  
  value._4_4_ = U_ZERO_ERROR;
  pSStack_28 = (SharedObject *)0x0;
  pUStack_18 = element;
  element_local = (UHashElement *)this;
  _fetch(this,element,&stack0xffffffffffffffd8,(UErrorCode *)((long)&value + 4));
  UVar1 = _inProgress(this,pSStack_28,value._4_4_);
  removeHardRef(this,pSStack_28);
  return UVar1;
}

Assistant:

UBool UnifiedCache::_inProgress(const UHashElement* element) const {
    UErrorCode status = U_ZERO_ERROR;
    const SharedObject * value = NULL;
    _fetch(element, value, status);
    UBool result = _inProgress(value, status);
    removeHardRef(value);
    return result;
}